

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_printf_as_uint32_array(run_container_t *cont,uint32_t base)

{
  ushort uVar1;
  ushort uVar2;
  int in_ESI;
  int *in_RDI;
  uint32_t j_1;
  uint16_t le_1;
  uint32_t run_start_1;
  int32_t i;
  uint32_t j;
  uint16_t le;
  uint32_t run_start;
  uint local_28;
  int local_1c;
  uint local_18;
  
  if (*in_RDI != 0) {
    uVar1 = **(ushort **)(in_RDI + 2);
    uVar2 = *(ushort *)(*(long *)(in_RDI + 2) + 2);
    printf("%u",(ulong)(in_ESI + (uint)uVar1));
    for (local_18 = 1; local_18 <= uVar2; local_18 = local_18 + 1) {
      printf(",%u",(ulong)(in_ESI + (uint)uVar1 + local_18));
    }
    for (local_1c = 1; local_1c < *in_RDI; local_1c = local_1c + 1) {
      uVar1 = *(ushort *)(*(long *)(in_RDI + 2) + (long)local_1c * 4);
      uVar2 = *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_1c * 4);
      for (local_28 = 0; local_28 <= uVar2; local_28 = local_28 + 1) {
        printf(",%u",(ulong)(in_ESI + (uint)uVar1 + local_28));
      }
    }
  }
  return;
}

Assistant:

void run_container_printf_as_uint32_array(const run_container_t *cont,
                                          uint32_t base) {
    if (cont->n_runs == 0) return;
    {
        uint32_t run_start = base + cont->runs[0].value;
        uint16_t le = cont->runs[0].length;
        printf("%u", run_start);
        for (uint32_t j = 1; j <= le; ++j) printf(",%u", run_start + j);
    }
    for (int32_t i = 1; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;
        for (uint32_t j = 0; j <= le; ++j) printf(",%u", run_start + j);
    }
}